

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O3

int (anonymous_namespace)::store_bool<int,char>(int *out,char *val)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  
  iVar1 = 3;
  if (out != (int *)0x0) {
    iVar1 = strcmp("false",(char *)out);
    uVar4 = 0;
    if (iVar1 != 0) {
      iVar1 = *out;
      uVar2 = (byte)iVar1 - 0x30;
      if (uVar2 == 0) {
        uVar2 = (uint)*(byte *)((long)out + 1);
      }
      if (uVar2 != 0) {
        iVar3 = strcmp("true",(char *)out);
        uVar4 = 1;
        if (iVar3 != 0) {
          uVar2 = (byte)iVar1 - 0x31;
          if (uVar2 == 0) {
            uVar2 = (uint)*(byte *)((long)out + 1);
          }
          if (uVar2 != 0) {
            return 3;
          }
        }
      }
    }
    iVar1 = 0;
    global_state_singleton._56_4_ = uVar4;
  }
  return iVar1;
}

Assistant:

int store_bool(INT_T *out, const CHAR_T *val)
{
    static const char* const s_zero  = "0";
    static const char* const s_one   = "1";
    static const char* const s_true  = "true";
    static const char* const s_false = "false";
    
    if (val == 0)
        return __CILKRTS_SET_PARAM_INVALID;

    if (strmatch(s_false, val) || strmatch(s_zero, val)) { 
        *out = 0;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    if (strmatch(s_true, val) || strmatch(s_one, val)) { 
        *out = 1;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    return __CILKRTS_SET_PARAM_INVALID;
}